

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpCore.cpp
# Opt level: O3

shared_ptr<helics::helicsCLI11App> __thiscall helics::tcp::TcpCoreSS::generateCLI(TcpCoreSS *this)

{
  App *pAVar1;
  Option *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>::generateCLI
            (&this->super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>)
  ;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"TCP Single Socket Core ","");
  generateCLI();
  pAVar1 = (App *)(this->
                  super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>).
                  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.super_CommonCore.
                  super_Core._vptr_Core;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"--connections","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"target link connections","");
  CLI::App::
  add_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_68,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RSI + 0xeb0),&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pAVar1 = (App *)(this->
                  super_NetworkCore<helics::tcp::TcpCommsSS,_(gmlc::networking::InterfaceTypes)0>).
                  super_CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>.super_CommonCore.
                  super_Core._vptr_Core;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"--no_outgoing_connection","")
  ;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"disable outgoing connections","");
  this_00 = CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
                      (pAVar1,&local_a8,(bool *)(in_RSI + 0xec8),&local_c8);
  CLI::Option::ignore_underscore<CLI::App>(this_00,true);
  _Var2._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> TcpCoreSS::generateCLI()
    {
        auto hApp = NetworkCore::generateCLI();
        hApp->description("TCP Single Socket Core ");
        hApp->add_option("--connections", connections, "target link connections");
        hApp->add_flag("--no_outgoing_connection",
                       no_outgoing_connections,
                       "disable outgoing connections")
            ->ignore_underscore();
        return hApp;
    }